

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O0

void Abc_NtkShowBdd(Abc_Ntk_t *pNtk,int fCompl)

{
  int iVar1;
  DdManager *dd_00;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  void *Entry;
  FILE *__stream;
  char **inames;
  char **onames;
  DdNode **ppDVar2;
  DdNode *pDVar3;
  DdNode **pbAdds;
  FILE *pFile;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vFuncsGlob;
  DdNode *bFunc;
  DdManager *dd;
  char **ppNamesOut;
  char **ppNamesIn;
  char FileNameDot [200];
  int fCompl_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    dd_00 = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,0);
    if (dd_00 == (DdManager *)0x0) {
      printf("Construction of global BDDs has failed.\n");
    }
    else {
      iVar1 = Abc_NtkCoNum(pNtk);
      p = Vec_PtrAlloc(iVar1);
      for (pFile._4_4_ = 0; iVar1 = Abc_NtkCoNum(pNtk), pFile._4_4_ < iVar1;
          pFile._4_4_ = pFile._4_4_ + 1) {
        pObj_00 = Abc_NtkCo(pNtk,pFile._4_4_);
        Entry = Abc_ObjGlobalBdd(pObj_00);
        Vec_PtrPush(p,Entry);
      }
      Abc_ShowGetFileName(pNtk->pName,(char *)&ppNamesIn);
      __stream = fopen((char *)&ppNamesIn,"w");
      if (__stream == (FILE *)0x0) {
        fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",&ppNamesIn);
      }
      else {
        inames = Abc_NtkCollectCioNames(pNtk,0);
        onames = Abc_NtkCollectCioNames(pNtk,1);
        if (fCompl == 0) {
          iVar1 = Vec_PtrSize(p);
          ppDVar2 = (DdNode **)malloc((long)iVar1 << 3);
          for (pFile._4_4_ = 0; iVar1 = Vec_PtrSize(p), pFile._4_4_ < iVar1;
              pFile._4_4_ = pFile._4_4_ + 1) {
            pDVar3 = (DdNode *)Vec_PtrEntry(p,pFile._4_4_);
            pDVar3 = Cudd_BddToAdd(dd_00,pDVar3);
            ppDVar2[pFile._4_4_] = pDVar3;
            Cudd_Ref(ppDVar2[pFile._4_4_]);
          }
          iVar1 = Abc_NtkCoNum(pNtk);
          Cudd_DumpDot(dd_00,iVar1,ppDVar2,inames,onames,(FILE *)__stream);
          for (pFile._4_4_ = 0; iVar1 = Vec_PtrSize(p), pFile._4_4_ < iVar1;
              pFile._4_4_ = pFile._4_4_ + 1) {
            Vec_PtrEntry(p,pFile._4_4_);
            Cudd_RecursiveDeref(dd_00,ppDVar2[pFile._4_4_]);
          }
          if (ppDVar2 != (DdNode **)0x0) {
            free(ppDVar2);
          }
        }
        else {
          iVar1 = Abc_NtkCoNum(pNtk);
          ppDVar2 = (DdNode **)Vec_PtrArray(p);
          Cudd_DumpDot(dd_00,iVar1,ppDVar2,inames,onames,(FILE *)__stream);
        }
        if (inames != (char **)0x0) {
          free(inames);
        }
        if (onames != (char **)0x0) {
          free(onames);
        }
        fclose(__stream);
        Abc_NtkFreeGlobalBdds(pNtk,0);
        for (pFile._4_4_ = 0; iVar1 = Vec_PtrSize(p), pFile._4_4_ < iVar1;
            pFile._4_4_ = pFile._4_4_ + 1) {
          pDVar3 = (DdNode *)Vec_PtrEntry(p,pFile._4_4_);
          Cudd_RecursiveDeref(dd_00,pDVar3);
        }
        Vec_PtrFree(p);
        Extra_StopManager(dd_00);
        Abc_NtkCleanCopy(pNtk);
        Abc_ShowFile((char *)&ppNamesIn);
      }
    }
    return;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcShow.c"
                ,0x85,"void Abc_NtkShowBdd(Abc_Ntk_t *, int)");
}

Assistant:

void Abc_NtkShowBdd( Abc_Ntk_t * pNtk, int fCompl )
{
    char FileNameDot[200];
    char ** ppNamesIn, ** ppNamesOut;
    DdManager * dd; DdNode * bFunc;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj; int i;
    FILE * pFile;

    assert( Abc_NtkIsStrash(pNtk) );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, 0 );
    if ( dd == NULL )
    {
        printf( "Construction of global BDDs has failed.\n" );
        return;
    }
    //printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );

    // create the file name
    Abc_ShowGetFileName( pNtk->pName, FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }

    // set the node names 
    ppNamesIn = Abc_NtkCollectCioNames( pNtk, 0 );
    ppNamesOut = Abc_NtkCollectCioNames( pNtk, 1 );
    if ( fCompl )
        Cudd_DumpDot( dd, Abc_NtkCoNum(pNtk), (DdNode **)Vec_PtrArray(vFuncsGlob), ppNamesIn, ppNamesOut, pFile );
    else
    {
        DdNode ** pbAdds = ABC_ALLOC( DdNode *, Vec_PtrSize(vFuncsGlob) );
        Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
            { pbAdds[i] = Cudd_BddToAdd( dd, bFunc ); Cudd_Ref( pbAdds[i] ); }
        Cudd_DumpDot( dd, Abc_NtkCoNum(pNtk), pbAdds, ppNamesIn, ppNamesOut, pFile );
        Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
            Cudd_RecursiveDeref( dd, pbAdds[i] );
        ABC_FREE( pbAdds );
    }
    ABC_FREE( ppNamesIn );
    ABC_FREE( ppNamesOut );
    fclose( pFile );

    // cleanup
    Abc_NtkFreeGlobalBdds( pNtk, 0 );
    Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vFuncsGlob );
    Extra_StopManager( dd );
    Abc_NtkCleanCopy( pNtk );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
}